

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

LY_ERR dict_insert(ly_ctx *ctx,char *value,size_t len,ly_bool zerocopy,char **str_p)

{
  undefined8 *puVar1;
  size_t __n;
  uint32_t hash;
  LY_ERR LVar2;
  void *pvVar3;
  ly_dict_rec *match;
  ly_dict_rec rec;
  undefined8 *local_58;
  size_t local_50;
  char **local_48;
  char *local_40;
  undefined4 local_38;
  
  local_58 = (undefined8 *)0x0;
  local_50 = len;
  local_48 = str_p;
  ly_log_dbg(1,"inserting \"%.*s\"",len,value);
  hash = lyht_hash(value,len);
  lyht_set_cb_data((ctx->dict).hash_tab,&local_50);
  local_38 = 1;
  local_40 = value;
  LVar2 = lyht_insert_with_resize_cb
                    ((ctx->dict).hash_tab,&local_40,hash,lydict_resize_val_eq,&local_58);
  __n = local_50;
  puVar1 = local_58;
  if (LVar2 == LY_SUCCESS) {
    local_58 = puVar1;
    if (zerocopy == '\0') {
      pvVar3 = malloc(local_50 + 1);
      *puVar1 = pvVar3;
      pvVar3 = (void *)*local_58;
      if (pvVar3 == (void *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","dict_insert");
        return LY_EMEM;
      }
      if (__n == 0) {
        local_50 = 0;
      }
      else {
        memcpy(pvVar3,value,__n);
        pvVar3 = (void *)*local_58;
      }
      *(undefined1 *)((long)pvVar3 + local_50) = 0;
    }
  }
  else {
    if (LVar2 != LY_EEXIST) {
      if (zerocopy == '\0') {
        return LVar2;
      }
      free(value);
      return LVar2;
    }
    *(int *)(local_58 + 1) = *(int *)(local_58 + 1) + 1;
    local_58 = puVar1;
    if (zerocopy != '\0') {
      free(value);
      local_58 = puVar1;
    }
  }
  *local_48 = (char *)*local_58;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
dict_insert(const struct ly_ctx *ctx, char *value, size_t len, ly_bool zerocopy, const char **str_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_dict_rec *match = NULL, rec;
    uint32_t hash;

    LOGDBG(LY_LDGDICT, "inserting \"%.*s\"", (int)len, value);

    hash = lyht_hash(value, len);
    /* set len as data for compare callback */
    lyht_set_cb_data(ctx->dict.hash_tab, (void *)&len);
    /* create record for lyht_insert */
    rec.value = value;
    rec.refcount = 1;

    ret = lyht_insert_with_resize_cb(ctx->dict.hash_tab, (void *)&rec, hash, lydict_resize_val_eq, (void **)&match);
    if (ret == LY_EEXIST) {
        match->refcount++;
        if (zerocopy) {
            free(value);
        }
        ret = LY_SUCCESS;
    } else if (ret == LY_SUCCESS) {
        if (!zerocopy) {
            /*
             * allocate string for new record
             * record is already inserted in hash table
             */
            match->value = malloc(sizeof *match->value * (len + 1));
            LY_CHECK_ERR_RET(!match->value, LOGMEM(ctx), LY_EMEM);
            if (len) {
                memcpy(match->value, value, len);
            }
            match->value[len] = '\0';
        }
    } else {
        /* lyht_insert returned error */
        if (zerocopy) {
            free(value);
        }
        return ret;
    }

    *str_p = match->value;

    return ret;
}